

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<Statement,_std::default_delete<Statement>_> __thiscall Parser::single(Parser *this)

{
  logic_error *this_00;
  undefined8 *in_RSI;
  unique_ptr<InputStatement,_std::default_delete<InputStatement>_> local_a0;
  unique_ptr<PrintStatement,_std::default_delete<PrintStatement>_> local_98;
  unique_ptr<DecrementStatement,_std::default_delete<DecrementStatement>_> local_90;
  unique_ptr<IncrementStatement,_std::default_delete<IncrementStatement>_> local_88;
  unique_ptr<ShiftRightStatement,_std::default_delete<ShiftRightStatement>_> local_80;
  unique_ptr<ShiftLeftStatement,_std::default_delete<ShiftLeftStatement>_> local_78;
  Token local_70;
  Token local_58;
  long local_40;
  longlong by;
  undefined1 local_30 [4];
  TokenKind type;
  Token token;
  Parser *this_local;
  
  TokenStream::next((Token *)local_30,(TokenStream *)*in_RSI);
  by._4_4_ = (TokenKind)token.span.end;
  if (((((TokenKind)token.span.end == LeftAngledBracket) ||
       ((TokenKind)token.span.end == RightAngledBracket)) || ((TokenKind)token.span.end == Plus)) ||
     ((TokenKind)token.span.end == Minus)) {
    local_40 = 1;
    while (TokenStream::lookahead(&local_58,(TokenStream *)*in_RSI), local_58.type == by._4_4_) {
      TokenStream::next(&local_70,(TokenStream *)*in_RSI);
      local_40 = local_40 + 1;
    }
    switch(by._4_4_) {
    case LeftAngledBracket:
      std::make_unique<ShiftLeftStatement,long_long&>((longlong *)&local_78);
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<ShiftLeftStatement,std::default_delete<ShiftLeftStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)this,&local_78);
      std::unique_ptr<ShiftLeftStatement,_std::default_delete<ShiftLeftStatement>_>::~unique_ptr
                (&local_78);
      break;
    case RightAngledBracket:
      std::make_unique<ShiftRightStatement,long_long&>((longlong *)&local_80);
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<ShiftRightStatement,std::default_delete<ShiftRightStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)this,&local_80);
      std::unique_ptr<ShiftRightStatement,_std::default_delete<ShiftRightStatement>_>::~unique_ptr
                (&local_80);
      break;
    default:
      goto LAB_00113ad7;
    case Plus:
      std::make_unique<IncrementStatement,long_long&>((longlong *)&local_88);
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<IncrementStatement,std::default_delete<IncrementStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)this,&local_88);
      std::unique_ptr<IncrementStatement,_std::default_delete<IncrementStatement>_>::~unique_ptr
                (&local_88);
      break;
    case Minus:
      std::make_unique<DecrementStatement,long_long&>((longlong *)&local_90);
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<DecrementStatement,std::default_delete<DecrementStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)this,&local_90);
      std::unique_ptr<DecrementStatement,_std::default_delete<DecrementStatement>_>::~unique_ptr
                (&local_90);
    }
  }
  else {
LAB_00113ad7:
    if (by._4_4_ == Dot) {
      std::make_unique<PrintStatement>();
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<PrintStatement,std::default_delete<PrintStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)this,&local_98);
      std::unique_ptr<PrintStatement,_std::default_delete<PrintStatement>_>::~unique_ptr(&local_98);
    }
    else {
      if (by._4_4_ != Comma) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Bad input.");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::make_unique<InputStatement>();
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<InputStatement,std::default_delete<InputStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)this,&local_a0);
      std::unique_ptr<InputStatement,_std::default_delete<InputStatement>_>::~unique_ptr(&local_a0);
    }
  }
  return (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)
         (__uniq_ptr_data<Statement,_std::default_delete<Statement>,_true,_true>)this;
}

Assistant:

auto Parser::single() -> std::unique_ptr<Statement> {
    auto token = tokenStream.next();
    auto type = token.type;

    if (type == TokenKind::LeftAngledBracket || type == TokenKind::RightAngledBracket || type == TokenKind::Plus || type == TokenKind::Minus) {
        long long by = 1;
        while (tokenStream.lookahead().type == type) {
            tokenStream.next();
            by++;
        }

        switch (type) {
            case TokenKind::LeftAngledBracket:
                return std::make_unique<ShiftLeftStatement>(by);
            case TokenKind::RightAngledBracket:
                return std::make_unique<ShiftRightStatement>(by);
            case TokenKind::Plus:
                return std::make_unique<IncrementStatement>(by);
            case TokenKind::Minus:
                return std::make_unique<DecrementStatement>(by);
        }
    }

    switch (type) {
        case TokenKind::Dot:
            return std::make_unique<PrintStatement>();
        case TokenKind::Comma:
            return std::make_unique<InputStatement>();
        default: throw std::logic_error("Bad input."); // TODO: Improve message
    }
}